

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  cTValue *o1_00;
  cTValue *o2_00;
  ulong uVar4;
  TValue *pTVar5;
  code *pcVar6;
  GCtab *t;
  
  t = (GCtab *)(ulong)(o1->gch).metatable.gcptr32;
  if ((t == (GCtab *)0x0) || ((t->nomm & 0x10) != 0)) goto LAB_00117657;
  o1_00 = lj_tab_getstr(t,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x1a8));
  if ((o1_00 != (cTValue *)0x0) && ((o1_00->field_2).it != 0xffffffff)) {
    uVar2 = (o2->gch).metatable.gcptr32;
    t = (GCtab *)(ulong)uVar2;
    if ((o1->gch).metatable.gcptr32 == uVar2) {
LAB_00117602:
      uVar4 = (ulong)L->base[-1].u32.lo;
      if (*(char *)(uVar4 + 6) == '\0') {
        pTVar5 = L->base + *(byte *)((ulong)*(uint *)(uVar4 + 0x10) - 0x39);
      }
      else {
        pTVar5 = L->top;
      }
      pcVar6 = lj_cont_condf;
      if (ne == 0) {
        pcVar6 = lj_cont_condt;
      }
      pTVar5->u64 = (uint64_t)(pcVar6 + -0x10acf0);
      pTVar5[1] = *o1_00;
      bVar1 = (o1->gch).gct;
      pTVar5[2].u32.lo = (uint32_t)o1;
      *(uint *)((long)pTVar5 + 0x14) = ~(uint)bVar1;
      pTVar5[3].u32.lo = (uint32_t)o2;
      *(uint *)((long)pTVar5 + 0x1c) = ~(uint)bVar1;
      return pTVar5 + 2;
    }
    if ((t == (GCtab *)0x0) || ((t->nomm & 0x10) != 0)) goto LAB_00117657;
    o2_00 = lj_tab_getstr(t,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x1a8));
    if ((o2_00 != (cTValue *)0x0) && ((o2_00->field_2).it != 0xffffffff)) {
      iVar3 = lj_obj_equal(o1_00,o2_00);
      if (iVar3 != 0) goto LAB_00117602;
      goto LAB_00117657;
    }
  }
  t->nomm = t->nomm | 0x10;
LAB_00117657:
  return (TValue *)(long)ne;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top++, ne ? lj_cont_condf : lj_cont_condt);
    if (LJ_FR2) setnilV(top++);
    copyTV(L, top++, mo);
    if (LJ_FR2) setnilV(top++);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top, o1, it);
    setgcV(L, top+1, o2, it);
    return top;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}